

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O1

int google::protobuf::internal::UTF8GenericScan
              (UTF8ScanObj *st,char *str,int str_length,int *bytes_consumed)

{
  byte *pbVar1;
  byte bVar2;
  uint8 *puVar3;
  byte *pbVar4;
  int iVar5;
  uint8 *puVar6;
  ulong uVar7;
  byte *pbVar8;
  uint8 *puVar9;
  byte *pbVar10;
  bool bVar11;
  uint local_44;
  int local_40;
  
  iVar5 = (int)str;
  *bytes_consumed = 0;
  if (str_length == 0) {
    local_44 = 0xf1;
  }
  else {
    pbVar1 = (byte *)(str + str_length);
    pbVar4 = (byte *)(str + (long)str_length + -7);
    if (str_length < 7) {
      pbVar4 = (byte *)str;
    }
    puVar6 = st->state_table + st->state0;
    puVar3 = st->fast_state;
    do {
      uVar7 = (ulong)str & 7;
      if ((str < pbVar1 && ((ulong)str & 7) != 0) && (uVar7 = 1, puVar3[(byte)*str] == '\0')) {
        pbVar8 = (byte *)str + 1;
        pbVar10 = pbVar8;
        do {
          str = (char *)pbVar10;
          uVar7 = (ulong)pbVar8 & 7;
          if ((uVar7 == 0) || (pbVar1 <= str)) break;
          pbVar8 = pbVar8 + 1;
          pbVar10 = (byte *)str + 1;
          uVar7 = 1;
        } while (puVar3[(byte)*str] == '\0');
      }
      if (uVar7 == 0) {
        do {
          if (pbVar4 <= str) break;
          pbVar10 = (byte *)str + 8;
          if (((*(int *)((byte *)str + 4) + st->hiadd | *(int *)((byte *)str + 4) - st->losub |
               *(int *)str + st->hiadd | *(int *)str - st->losub) & 0x80808080) == 0) {
            bVar11 = true;
          }
          else if (((puVar3[((byte *)str)[1]] == '\0' && puVar3[(byte)*str] == '\0') &&
                   puVar3[((byte *)str)[2]] == '\0') && puVar3[((byte *)str)[3]] == '\0') {
            bVar11 = ((puVar3[((byte *)str)[5]] == '\0' && puVar3[((byte *)str)[4]] == '\0') &&
                     puVar3[((byte *)str)[6]] == '\0') && puVar3[((byte *)str)[7]] == '\0';
            if (((puVar3[((byte *)str)[5]] != '\0' || puVar3[((byte *)str)[4]] != '\0') ||
                puVar3[((byte *)str)[6]] != '\0') || puVar3[((byte *)str)[7]] != '\0') {
              pbVar10 = (byte *)str + 4;
            }
          }
          else {
            bVar11 = false;
            pbVar10 = (byte *)str;
          }
          str = (char *)pbVar10;
        } while (bVar11);
      }
      local_44 = 0;
      puVar9 = puVar6;
      if (str < pbVar1) {
        do {
          pbVar10 = (byte *)str;
          bVar2 = puVar9[*pbVar10];
          local_44 = (uint)bVar2;
          if (0xef < bVar2) break;
          puVar9 = puVar6 + (int)((uint)bVar2 << ((byte)st->entry_shift & 0x1f));
          str = (char *)(pbVar10 + 1);
        } while (pbVar10 + 1 < pbVar1);
        str = (char *)(pbVar10 + 1);
      }
      local_40 = (int)st->state_table;
      if (local_44 < 0xf0) {
        local_44 = 0xf1;
        if (st->state0_size <= (int)puVar9 - (st->state0 + local_40)) {
          str = (char *)((byte *)str + -1);
          local_44 = 0xf0;
        }
      }
      else if ((int)puVar9 - (st->state0 + local_40) < st->state0_size) {
        str = (char *)((byte *)str + -1);
      }
      else {
        str = (char *)((byte *)str + -2);
      }
    } while (local_44 == 0xfd);
    *bytes_consumed = (int)str - iVar5;
  }
  return local_44;
}

Assistant:

int UTF8GenericScan(const UTF8ScanObj* st,
                    const char * str,
                    int str_length,
                    int* bytes_consumed) {
  *bytes_consumed = 0;
  if (str_length == 0) return kExitOK;

  int eshift = st->entry_shift;
  const uint8* isrc = reinterpret_cast<const uint8*>(str);
  const uint8* src = isrc;
  const uint8* srclimit = isrc + str_length;
  const uint8* srclimit8 = str_length < 7 ? isrc : srclimit - 7;
  const uint8* Tbl_0 = &st->state_table[st->state0];

 DoAgain:
  // Do state-table scan
  int e = 0;
  uint8 c;
  const uint8* Tbl2 = &st->fast_state[0];
  const uint32 losub = st->losub;
  const uint32 hiadd = st->hiadd;
  // Check initial few bytes one at a time until 8-byte aligned
  //----------------------------
  while ((((uintptr_t)src & 0x07) != 0) &&
         (src < srclimit) &&
         Tbl2[src[0]] == 0) {
    src++;
  }
  if (((uintptr_t)src & 0x07) == 0) {
    // Do fast for groups of 8 identity bytes.
    // This covers a lot of 7-bit ASCII ~8x faster then the 1-byte loop,
    // including slowing slightly on cr/lf/ht
    //----------------------------
    while (src < srclimit8) {
      uint32 s0123 = (reinterpret_cast<const uint32 *>(src))[0];
      uint32 s4567 = (reinterpret_cast<const uint32 *>(src))[1];
      src += 8;
      // This is a fast range check for all bytes in [lowsub..0x80-hiadd)
      uint32 temp = (s0123 - losub) | (s0123 + hiadd) |
                    (s4567 - losub) | (s4567 + hiadd);
      if ((temp & 0x80808080) != 0) {
        // We typically end up here on cr/lf/ht; src was incremented
        int e0123 = (Tbl2[src[-8]] | Tbl2[src[-7]]) |
                    (Tbl2[src[-6]] | Tbl2[src[-5]]);
        if (e0123 != 0) {
          src -= 8;
          break;
        }    // Exit on Non-interchange
        e0123 = (Tbl2[src[-4]] | Tbl2[src[-3]]) |
                (Tbl2[src[-2]] | Tbl2[src[-1]]);
        if (e0123 != 0) {
          src -= 4;
          break;
        }    // Exit on Non-interchange
        // Else OK, go around again
      }
    }
  }
  //----------------------------

  // Byte-at-a-time scan
  //----------------------------
  const uint8* Tbl = Tbl_0;
  while (src < srclimit) {
    c = *src;
    e = Tbl[c];
    src++;
    if (e >= kExitIllegalStructure) {break;}
    Tbl = &Tbl_0[e << eshift];
  }
  //----------------------------

  // Exit possibilities:
  //  Some exit code, !state0, back up over last char
  //  Some exit code, state0, back up one byte exactly
  //  source consumed, !state0, back up over partial char
  //  source consumed, state0, exit OK
  // For illegal byte in state0, avoid backup up over PREVIOUS char
  // For truncated last char, back up to beginning of it

  if (e >= kExitIllegalStructure) {
    // Back up over exactly one byte of rejected/illegal UTF-8 character
    src--;
    // Back up more if needed
    if (!InStateZero(st, Tbl)) {
      do {
        src--;
      } while ((src > isrc) && ((src[0] & 0xc0) == 0x80));
    }
  } else if (!InStateZero(st, Tbl)) {
    // Back up over truncated UTF-8 character
    e = kExitIllegalStructure;
    do {
      src--;
    } while ((src > isrc) && ((src[0] & 0xc0) == 0x80));
  } else {
    // Normal termination, source fully consumed
    e = kExitOK;
  }

  if (e == kExitDoAgain) {
    // Loop back up to the fast scan
    goto DoAgain;
  }

  *bytes_consumed = src - isrc;
  return e;
}